

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O1

void Abc_NtkShowBdd(Abc_Ntk_t *pNtk,int fCompl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  DdManager *dd;
  uint *__ptr;
  void *pvVar5;
  Vec_Ptr_t *pVVar6;
  undefined8 uVar7;
  FILE *__stream;
  char **inames;
  char **onames;
  DdNode **f;
  DdNode *n;
  uint uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  char FileNameDot [200];
  char local_f8 [200];
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcShow.c"
                  ,0x85,"void Abc_NtkShowBdd(Abc_Ntk_t *, int)");
  }
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,1,0,0);
  if (dd == (DdManager *)0x0) {
    puts("Construction of global BDDs has failed.");
    return;
  }
  uVar1 = pNtk->vCos->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar1 - 1) {
    uVar8 = uVar1;
  }
  __ptr[1] = 0;
  *__ptr = uVar8;
  if (uVar8 == 0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = malloc((long)(int)uVar8 << 3);
  }
  *(void **)(__ptr + 2) = pvVar5;
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar10 = 0;
    do {
      lVar12 = *(long *)(*pVVar6->pArray[lVar10] + 0x1b0);
      if (*(int *)(lVar12 + 4) < 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar4 = *(int **)(*(long *)(lVar12 + 8) + 0x38);
      if (*(void **)(piVar4 + 2) == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar2 = (int)*(long *)((long)pVVar6->pArray[lVar10] + 0x10);
      lVar12 = (long)iVar2;
      iVar3 = *piVar4;
      if (iVar3 <= iVar2) {
        iVar9 = iVar2 + 10;
        if (iVar2 < iVar3 * 2) {
          iVar9 = iVar3 * 2;
        }
        if (iVar3 < iVar9) {
          pvVar5 = realloc(*(void **)(piVar4 + 2),(long)iVar9 * 8);
          *(void **)(piVar4 + 2) = pvVar5;
          memset((void *)((long)pvVar5 + (long)*piVar4 * 8),0,((long)iVar9 - (long)*piVar4) * 8);
          *piVar4 = iVar9;
        }
      }
      if ((*(long *)(*(long *)(piVar4 + 2) + lVar12 * 8) == 0) &&
         (*(code **)(piVar4 + 8) != (code *)0x0)) {
        uVar7 = (**(code **)(piVar4 + 8))(*(undefined8 *)(piVar4 + 4));
        *(undefined8 *)(*(long *)(piVar4 + 2) + lVar12 * 8) = uVar7;
      }
      uVar7 = *(undefined8 *)(*(long *)(piVar4 + 2) + lVar12 * 8);
      uVar1 = __ptr[1];
      uVar8 = *__ptr;
      if (uVar1 == uVar8) {
        if ((int)uVar8 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc(0x80);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar11 = 0x10;
        }
        else {
          uVar11 = uVar8 * 2;
          if ((int)uVar11 <= (int)uVar8) goto LAB_00867726;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar5 = malloc((ulong)uVar8 << 4);
          }
          else {
            pvVar5 = realloc(*(void **)(__ptr + 2),(ulong)uVar8 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar5;
        *__ptr = uVar11;
      }
LAB_00867726:
      __ptr[1] = uVar1 + 1;
      *(undefined8 *)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 8) = uVar7;
      lVar10 = lVar10 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar10 < pVVar6->nSize);
  }
  Abc_ShowGetFileName(pNtk->pName,local_f8);
  __stream = fopen(local_f8,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",local_f8);
  }
  else {
    inames = Abc_NtkCollectCioNames(pNtk,0);
    onames = Abc_NtkCollectCioNames(pNtk,1);
    if (fCompl == 0) {
      uVar1 = __ptr[1];
      lVar10 = (long)(int)uVar1;
      f = (DdNode **)malloc(lVar10 * 8);
      if (0 < lVar10) {
        lVar12 = *(long *)(__ptr + 2);
        lVar13 = 0;
        do {
          n = Cudd_BddToAdd(dd,*(DdNode **)(lVar12 + lVar13 * 8));
          f[lVar13] = n;
          Cudd_Ref(n);
          lVar13 = lVar13 + 1;
        } while (lVar10 != lVar13);
      }
      Cudd_DumpDot(dd,pNtk->vCos->nSize,f,inames,onames,(FILE *)__stream);
      if (0 < (int)uVar1) {
        lVar12 = 0;
        do {
          Cudd_RecursiveDeref(dd,f[lVar12]);
          lVar12 = lVar12 + 1;
        } while (lVar10 != lVar12);
      }
      if (f != (DdNode **)0x0) {
        free(f);
      }
    }
    else {
      Cudd_DumpDot(dd,pNtk->vCos->nSize,*(DdNode ***)(__ptr + 2),inames,onames,(FILE *)__stream);
    }
    if (inames != (char **)0x0) {
      free(inames);
    }
    if (onames != (char **)0x0) {
      free(onames);
    }
    fclose(__stream);
    Abc_NtkFreeGlobalBdds(pNtk,0);
    uVar1 = __ptr[1];
    if (0 < (long)(int)uVar1) {
      lVar10 = *(long *)(__ptr + 2);
      lVar12 = 0;
      do {
        Cudd_RecursiveDeref(dd,*(DdNode **)(lVar10 + lVar12 * 8));
        lVar12 = lVar12 + 1;
      } while ((int)uVar1 != lVar12);
    }
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
    Extra_StopManager(dd);
    Abc_NtkCleanCopy(pNtk);
    Abc_ShowFile(local_f8);
  }
  return;
}

Assistant:

void Abc_NtkShowBdd( Abc_Ntk_t * pNtk, int fCompl )
{
    char FileNameDot[200];
    char ** ppNamesIn, ** ppNamesOut;
    DdManager * dd; DdNode * bFunc;
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj; int i;
    FILE * pFile;

    assert( Abc_NtkIsStrash(pNtk) );
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, 10000000, 1, 1, 0, 0 );
    if ( dd == NULL )
    {
        printf( "Construction of global BDDs has failed.\n" );
        return;
    }
    //printf( "Shared BDD size = %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );

    // create the file name
    Abc_ShowGetFileName( pNtk->pName, FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }

    // set the node names 
    ppNamesIn = Abc_NtkCollectCioNames( pNtk, 0 );
    ppNamesOut = Abc_NtkCollectCioNames( pNtk, 1 );
    if ( fCompl )
        Cudd_DumpDot( dd, Abc_NtkCoNum(pNtk), (DdNode **)Vec_PtrArray(vFuncsGlob), ppNamesIn, ppNamesOut, pFile );
    else
    {
        DdNode ** pbAdds = ABC_ALLOC( DdNode *, Vec_PtrSize(vFuncsGlob) );
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            { pbAdds[i] = Cudd_BddToAdd( dd, bFunc ); Cudd_Ref( pbAdds[i] ); }
        Cudd_DumpDot( dd, Abc_NtkCoNum(pNtk), pbAdds, ppNamesIn, ppNamesOut, pFile );
        Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
            Cudd_RecursiveDeref( dd, pbAdds[i] );
        ABC_FREE( pbAdds );
    }
    ABC_FREE( ppNamesIn );
    ABC_FREE( ppNamesOut );
    fclose( pFile );

    // cleanup
    Abc_NtkFreeGlobalBdds( pNtk, 0 );
    Vec_PtrForEachEntry( DdNode *, vFuncsGlob, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vFuncsGlob );
    Extra_StopManager( dd );
    Abc_NtkCleanCopy( pNtk );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}